

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_initDCtx_internal(ZSTD_DCtx *dctx)

{
  int iVar1;
  long in_RDI;
  
  *(undefined8 *)(in_RDI + 0x75d8) = 0;
  *(undefined8 *)(in_RDI + 0x75f0) = 0;
  *(undefined8 *)(in_RDI + 0x75e8) = 0;
  *(undefined8 *)(in_RDI + 0x74d8) = 0;
  *(undefined4 *)(in_RDI + 0x75fc) = 0;
  *(undefined4 *)(in_RDI + 0x7600) = 0;
  *(undefined8 *)(in_RDI + 0x7620) = 0;
  *(undefined8 *)(in_RDI + 0x7628) = 0;
  *(undefined8 *)(in_RDI + 0x7648) = 0;
  *(undefined4 *)(in_RDI + 0x7618) = 0;
  *(undefined4 *)(in_RDI + 0x766c) = 0;
  *(undefined8 *)(in_RDI + 0x176d8) = 0;
  iVar1 = ZSTD_cpuSupportsBmi2();
  *(int *)(in_RDI + 0x75e0) = iVar1;
  *(undefined8 *)(in_RDI + 0x7608) = 0;
  ZSTD_DCtx_resetParameters((ZSTD_DCtx *)0x2f2c1e);
  return;
}

Assistant:

static void ZSTD_initDCtx_internal(ZSTD_DCtx* dctx)
{
    dctx->staticSize  = 0;
    dctx->ddict       = NULL;
    dctx->ddictLocal  = NULL;
    dctx->dictEnd     = NULL;
    dctx->ddictIsCold = 0;
    dctx->dictUses = ZSTD_dont_use;
    dctx->inBuff      = NULL;
    dctx->inBuffSize  = 0;
    dctx->outBuffSize = 0;
    dctx->streamStage = zdss_init;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
    dctx->legacyContext = NULL;
    dctx->previousLegacyVersion = 0;
#endif
    dctx->noForwardProgress = 0;
    dctx->oversizedDuration = 0;
#if DYNAMIC_BMI2
    dctx->bmi2 = ZSTD_cpuSupportsBmi2();
#endif
    dctx->ddictSet = NULL;
    ZSTD_DCtx_resetParameters(dctx);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    dctx->dictContentEndForFuzzing = NULL;
#endif
}